

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O0

void __thiscall server::captureservmode::replenishammo(captureservmode *this,clientinfo *ci)

{
  bool bVar1;
  int iVar2;
  baseinfo *this_00;
  baseinfo *b;
  int i;
  clientinfo *ci_local;
  captureservmode *this_local;
  
  if (((((gamemode < -3) || (0x16 < gamemode)) || ((gamemodes[gamemode + 3].flags & 2U) == 0)) &&
      (((this->notgotbases & 1U) == 0 && ((ci->state).state == 0)))) && (ci->team[0] != '\0')) {
    for (b._4_4_ = 0; iVar2 = vector<server::captureservmode::baseinfo>::length(&this->bases),
        b._4_4_ < iVar2; b._4_4_ = b._4_4_ + 1) {
      this_00 = vector<server::captureservmode::baseinfo>::operator[](&this->bases,b._4_4_);
      bVar1 = baseinfo::valid(this_00);
      if (((bVar1) && (bVar1 = insidebase(this,this_00,&(ci->state).o), bVar1)) &&
         ((bVar1 = fpsstate::hasmaxammo(&(ci->state).super_fpsstate,this_00->ammotype + 7), !bVar1
          && (bVar1 = baseinfo::takeammo(this_00,ci->team), bVar1)))) {
        sendbaseinfo(this,b._4_4_);
        sendf(-1,1,"riii",0x44,(ulong)(uint)ci->clientnum,(ulong)(uint)this_00->ammotype);
        fpsstate::addammo(&(ci->state).super_fpsstate,this_00->ammotype,1,1);
        return;
      }
    }
  }
  return;
}

Assistant:

void replenishammo(clientinfo *ci)
    {
        if(m_noitems || notgotbases || ci->state.state!=CS_ALIVE || !ci->team[0]) return;
        loopv(bases)
        {
            baseinfo &b = bases[i];
            if(b.valid() && insidebase(b, ci->state.o) && !ci->state.hasmaxammo(b.ammotype-1+I_SHELLS) && b.takeammo(ci->team))
            {
                sendbaseinfo(i);
                sendf(-1, 1, "riii", N_REPAMMO, ci->clientnum, b.ammotype);
                ci->state.addammo(b.ammotype);
                break;
            }
        }
    }